

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

int __thiscall pbrt::Shape::writeTo(Shape *this,BinaryWriter *binary)

{
  int32_t local_3c;
  __shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Material,void>
            (local_28,&(this->material).
                       super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>);
  local_3c = BinaryWriter::serialize(binary,(SP *)local_28);
  BinaryWriter::write<int>(binary,&local_3c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  BinaryWriter::write<std::__cxx11::string,pbrt::Texture>(binary,&this->textures);
  std::__shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,
             &(this->areaLight).super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>);
  BinaryWriter::write<pbrt::AreaLight>(binary,(shared_ptr<pbrt::AreaLight> *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  local_3c = CONCAT31(local_3c._1_3_,this->reverseOrientation);
  BinaryWriter::write<signed_char>(binary,(char *)&local_3c);
  BinaryWriter::write<float>(binary,&this->alpha);
  return 3;
}

Assistant:

int Shape::writeTo(BinaryWriter &binary) 
  {
    binary.write(binary.serialize(material));
    binary.write(textures);
    binary.write(areaLight);
    binary.write((int8_t)reverseOrientation);
    binary.write(alpha);
    return TYPE_SHAPE;
  }